

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O0

BOOL PALInitLock(void)

{
  BOOL BVar1;
  undefined8 local_20;
  CPalThread *pThread;
  
  if (init_critsec == (PCRITICAL_SECTION)0x0) {
    pThread._4_4_ = 0;
  }
  else {
    BVar1 = PALIsThreadDataInitialized();
    if (BVar1 == 0) {
      local_20 = (CPalThread *)0x0;
    }
    else {
      local_20 = CorUnix::InternalGetCurrentThread();
    }
    CorUnix::InternalEnterCriticalSection(local_20,init_critsec);
    pThread._4_4_ = 1;
  }
  return pThread._4_4_;
}

Assistant:

BOOL PALInitLock(void)
{
    if(!init_critsec)
    {
        return FALSE;
    }

    CPalThread * pThread =
        (PALIsThreadDataInitialized() ? InternalGetCurrentThread() : NULL);

    InternalEnterCriticalSection(pThread, init_critsec);
    return TRUE;
}